

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

void __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *p)

{
  C *in_RSI;
  BufHdr *in_RDI;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *unaff_retaddr;
  C *p_00;
  BufHdr *hdr;
  
  hdr = in_RDI;
  initialize((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RDI);
  p_00 = in_RSI;
  StringDetailsBase<char>::calcLength((C *)in_RDI);
  attach(unaff_retaddr,hdr,p_00,(size_t)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

StringRefBase(const C* p) {
		initialize();
		attach(NULL, p, Details::calcLength(p), p != NULL);
	}